

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sketch_impl.h
# Opt level: O1

bool RecFindRoots<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
               (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                *stack,size_t pos,vector<unsigned_int,_std::allocator<unsigned_int>_> *roots,
               bool fully_factorizable,int depth,Elem randv,
               Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
               *field)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *mod;
  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
  *this;
  pointer pvVar1;
  uint *__args;
  iterator iVar2;
  pointer puVar3;
  undefined4 *puVar4;
  pointer puVar5;
  pointer puVar6;
  pointer puVar7;
  pointer puVar8;
  bool bVar9;
  Elem EVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  undefined7 in_register_00000009;
  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
  *pFVar14;
  uint uVar15;
  uint uVar16;
  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
  *extraout_RDX;
  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
  *extraout_RDX_00;
  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
  *extraout_RDX_01;
  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
  *pFVar17;
  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
  *field_00;
  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
  *this_00;
  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
  *pFVar18;
  ulong uVar19;
  long lVar20;
  int iVar21;
  long in_FS_OFFSET;
  undefined4 in_stack_fffffffffffffd88;
  uint local_23c;
  Elem sol;
  uint auStack_1f8 [16];
  uint auStack_1b8 [16];
  uint auStack_178 [16];
  uint auStack_138 [16];
  uint auStack_f8 [16];
  uint auStack_b8 [16];
  uint auStack_78 [16];
  long local_38;
  
  uVar19 = CONCAT71(in_register_00000009,fully_factorizable) & 0xffffffff;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar1 = (stack->
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  __args = pvVar1[pos].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar11 = (long)*(pointer *)
                  ((long)&pvVar1[pos].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data + 8) - (long)__args >> 2;
  if (lVar11 == 3) {
    if (__args[1] == 0) goto LAB_00163a3e;
    uVar16 = *__args;
    EVar10 = anon_unknown.dwarf_418a755::
             Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
             ::Inv((Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                    *)(ulong)__args[1],(Elem)pos);
    uVar15 = EVar10 >> 10 & 0x7c;
    EVar10 = anon_unknown.dwarf_418a755::
             Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
             ::Mul((Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                    *)(ulong)uVar16,
                   *(uint *)((anonymous_namespace)::SQR_TABLE_32 +
                            (ulong)(EVar10 >> 4 & 0xfc) + 0x100) ^
                   *(uint *)((anonymous_namespace)::SQR_TABLE_32 + (ulong)(EVar10 & 0x3f) * 4) ^
                   *(uint *)((anonymous_namespace)::SQR_TABLE_32 + (ulong)uVar15 + 0x200) ^
                   *(uint *)((anonymous_namespace)::SQR_TABLE_32 +
                            (ulong)(EVar10 >> 0xf & 0x7c) + 0x280) ^
                   *(uint *)((anonymous_namespace)::SQR_TABLE_32 +
                            (ulong)(EVar10 >> 0x14 & 0x7c) + 0x300) ^
                   *(uint *)((anonymous_namespace)::SQR_TABLE_32 +
                            (ulong)(EVar10 >> 0x1b) * 4 + 0x380),uVar15);
    uVar15 = *(uint *)((anonymous_namespace)::QRT_TABLE_32 + (ulong)(EVar10 >> 4 & 0xfc) + 0x100) ^
             *(uint *)((anonymous_namespace)::QRT_TABLE_32 + (ulong)(EVar10 & 0x3f) * 4) ^
             *(uint *)((anonymous_namespace)::QRT_TABLE_32 + (ulong)(EVar10 >> 10 & 0x7c) + 0x200) ^
             *(uint *)((anonymous_namespace)::QRT_TABLE_32 + (ulong)(EVar10 >> 0xf & 0x7c) + 0x280)
             ^ *(uint *)((anonymous_namespace)::QRT_TABLE_32 +
                        (ulong)(EVar10 >> 0x14 & 0x7c) + 0x300) ^
             *(uint *)((anonymous_namespace)::QRT_TABLE_32 + (ulong)(EVar10 >> 0x1b) * 4 + 0x380);
    uVar16 = uVar15 >> 4 & 0xfc;
    bVar9 = (*(uint *)((anonymous_namespace)::SQR_TABLE_32 + (ulong)(uVar15 & 0x3f) * 4) ^
             *(uint *)((anonymous_namespace)::SQR_TABLE_32 + (ulong)uVar16 + 0x100) ^
             *(uint *)((anonymous_namespace)::SQR_TABLE_32 + (ulong)(uVar15 >> 10 & 0x7c) + 0x200) ^
             *(uint *)((anonymous_namespace)::SQR_TABLE_32 + (ulong)(uVar15 >> 0xf & 0x7c) + 0x280)
             ^ *(uint *)((anonymous_namespace)::SQR_TABLE_32 +
                        (ulong)(uVar15 >> 0x14 & 0x7c) + 0x300) ^
             *(uint *)((anonymous_namespace)::SQR_TABLE_32 + (ulong)(uVar15 >> 0x1b) * 4 + 0x380) ^
            uVar15) == EVar10;
    if (!bVar9) goto LAB_00163a83;
    sol = anon_unknown.dwarf_418a755::
          Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
          ::Mul((Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                 *)(ulong)uVar15,
                *(Elem *)(*(long *)&pvVar1[pos].
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data + 4),uVar16);
    iVar2._M_current =
         (roots->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (roots->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)roots,iVar2,&sol);
    }
    else {
      *iVar2._M_current = sol;
      (roots->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    local_23c = *(uint *)(*(long *)&pvVar1[pos].
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data + 4) ^ sol;
    iVar2._M_current =
         (roots->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (roots->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (roots,iVar2,&local_23c);
    }
    else {
      *iVar2._M_current = local_23c;
      (roots->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
  }
  else {
    if (lVar11 != 2) {
      if ((ulong)(((long)(stack->
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18) <
          pos + 3) {
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::resize(stack,(pos + 3) * 2);
      }
      pvVar1 = (stack->
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      mod = pvVar1 + pos;
      this_00 = (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                 *)(pvVar1 + pos + 1);
      puVar3 = pvVar1[pos + 2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar1[pos + 2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data + 8) != puVar3) {
        mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar3;
      }
      if (*(pointer *)
           ((long)&pvVar1[pos + 1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data + 8) != *(pointer *)this_00) {
        *(pointer *)
         ((long)&pvVar1[pos + 1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data + 8) = *(pointer *)this_00;
      }
      this = (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
              *)(pvVar1 + pos + 2);
      iVar13 = 0;
      do {
        uVar16 = (uint)uVar19;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this,
                   (long)(mod->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(mod->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_start >> 1);
        pFVar18 = (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                   *)0x2;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this,2);
        puVar4 = *(undefined4 **)this;
        *puVar4 = 0;
        puVar4[1] = randv;
        iVar21 = 0x1f;
        do {
          Sqr<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this,pFVar18);
          pFVar17 = extraout_RDX;
          if ((ulong)((long)mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start) < 5) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this,2);
            pFVar17 = extraout_RDX_00;
          }
          *(Elem *)(*(long *)this + 4) = randv;
          pFVar18 = this;
          PolyMod<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
                    (mod,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)this,pFVar17);
          iVar21 = iVar21 + -1;
        } while (iVar21 != 0);
        if ((iVar13 != 0) && ((uVar16 & 1) == 0)) {
          pFVar18 = this;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this);
          Sqr<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,pFVar18);
          puVar3 = mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar11 = (long)mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)puVar3;
          pFVar17 = extraout_RDX_01;
          if (lVar11 != 0) {
            lVar11 = lVar11 >> 2;
            pFVar17 = *(Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                        **)this_00;
            lVar20 = 0;
            do {
              *(uint *)(pFVar17 + lVar20 * 4) = *(uint *)(pFVar17 + lVar20 * 4) ^ puVar3[lVar20];
              lVar20 = lVar20 + 1;
            } while (lVar11 + (ulong)(lVar11 == 0) != lVar20);
          }
          pFVar18 = *(Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                      **)this_00;
          pFVar14 = *(Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                      **)((long)&pvVar1[pos + 1].
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data + 8);
          if (pFVar14 != pFVar18) {
            pFVar14 = pFVar14 + -4;
            do {
              if (*(int *)pFVar14 != 0) break;
              *(Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                **)((long)&pvVar1[pos + 1].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data + 8) = pFVar14;
              pFVar17 = pFVar14 + -4;
              bVar9 = pFVar14 != pFVar18;
              pFVar14 = pFVar17;
            } while (bVar9);
          }
          pFVar18 = this_00;
          uVar15 = uVar16;
          PolyMod<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
                    (mod,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,pFVar17);
          uVar16 = 1;
          if (*(pointer *)
               ((long)&pvVar1[pos + 1].
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data + 8) != *(pointer *)this_00) {
            bVar9 = false;
            uVar16 = uVar15;
            goto LAB_00163a3a;
          }
        }
        if (((-0x20 < depth & (byte)uVar16) == 1) &&
           (((long)(mod->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(mod->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2) - 2U >> (-((char)depth + ' ') & 0x3fU) !=
            0)) {
          bVar9 = false;
          goto LAB_00163a3a;
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,mod);
        puVar3 = mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar5 = mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pFVar18 = *(Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                    **)this_00;
        puVar6 = *(pointer *)
                  ((long)&pvVar1[pos + 1].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data + 8);
        if ((ulong)((long)puVar5 - (long)puVar3) < (ulong)((long)puVar6 - (long)pFVar18)) {
          puVar7 = mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)pFVar18;
          mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = puVar6;
          mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               *(pointer *)
                ((long)&pvVar1[pos + 1].
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data + 0x10);
          *(pointer *)this_00 = puVar3;
          *(pointer *)
           ((long)&pvVar1[pos + 1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data + 8) = puVar5;
          *(pointer *)
           ((long)&pvVar1[pos + 1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data + 0x10) = puVar7;
        }
        depth = depth + 1;
        randv = (int)randv >> 0x1f & 0x8dU ^ randv * 2;
        while (lVar11 = (long)*(pointer *)
                               ((long)&pvVar1[pos + 1].
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data + 8) - *(long *)this_00 >> 2
              , lVar11 != 0) {
          if (lVar11 == 1) {
            pFVar18 = (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                       *)0x1;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this,1);
            **(undefined4 **)this = 1;
            break;
          }
          MakeMonic<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,pFVar18);
          pFVar18 = this;
          PolyMod<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this,field_00);
          puVar3 = mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               *(pointer *)
                ((long)&pvVar1[pos + 1].
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data + 0x10);
          puVar5 = mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar6 = mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          puVar7 = *(pointer *)
                    ((long)&pvVar1[pos + 1].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data + 8);
          mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = *(pointer *)this_00;
          mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = puVar7;
          *(pointer *)this_00 = puVar5;
          *(pointer *)
           ((long)&pvVar1[pos + 1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data + 8) = puVar6;
          *(pointer *)
           ((long)&pvVar1[pos + 1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data + 0x10) = puVar3;
        }
        uVar12 = (long)mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        iVar13 = iVar13 + 1;
        uVar19 = (ulong)uVar16;
      } while ((uVar12 < 5) ||
              (uVar19 = (ulong)uVar16,
              uVar12 == (long)(mod->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(mod->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                              ._M_impl.super__Vector_impl_data._M_start));
      bVar9 = true;
LAB_00163a3a:
      if (bVar9) {
        MakeMonic<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this,pFVar18);
        uVar12 = (long)mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 2;
        uVar19 = (long)(mod->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(mod->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start >> 2;
        if (uVar19 < uVar12) {
          if (*(pointer *)
               ((long)&pvVar1[pos + 1].
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data + 8) != *(pointer *)this_00) {
            *(pointer *)
             ((long)&pvVar1[pos + 1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data + 8) = *(pointer *)this_00;
          }
        }
        else {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,
                     (uVar19 - uVar12) + 1);
          puVar3 = (mod->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          lVar11 = (long)puVar3 -
                   (long)(mod->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_start;
          while (uVar12 <= (ulong)(lVar11 >> 2)) {
            uVar15 = puVar3[-1];
            lVar20 = *(long *)this_00;
            *(uint *)(lVar20 + ((lVar11 >> 2) - uVar12) * 4) = uVar15;
            (mod->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish = puVar3 + -1;
            if (uVar15 != 0) {
              anon_unknown.dwarf_418a755::
              Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
              ::Multiplier::Multiplier
                        ((Multiplier *)&sol,
                         (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                          *)(ulong)uVar15,(Elem)lVar20);
              puVar3 = mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              lVar11 = (long)mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 2;
              if (lVar11 != 1) {
                puVar5 = (mod->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_start;
                puVar6 = (mod->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_finish;
                lVar20 = 0;
                do {
                  uVar15 = puVar3[lVar20];
                  puVar7 = puVar5 + (((ulong)((long)puVar6 - (long)puVar5) >> 2) - uVar12) +
                                    lVar20 + 1;
                  *puVar7 = *puVar7 ^ *(uint *)((long)auStack_1f8 + (ulong)(uVar15 >> 2 & 0x3c)) ^
                                      (&sol)[uVar15 & 0xf] ^
                                      *(uint *)((long)auStack_1b8 + (ulong)(uVar15 >> 6 & 0x3c)) ^
                                      *(uint *)((long)auStack_178 + (ulong)(uVar15 >> 10 & 0x3c)) ^
                                      *(uint *)((long)auStack_138 + (ulong)(uVar15 >> 0xe & 0x3c)) ^
                                      *(uint *)((long)auStack_f8 + (ulong)(uVar15 >> 0x12 & 0x3c)) ^
                                      *(uint *)((long)auStack_b8 + (ulong)(uVar15 >> 0x16 & 0x3c)) ^
                                      auStack_78[uVar15 >> 0x1c];
                  lVar20 = lVar20 + 1;
                } while (lVar11 + -1 != lVar20);
              }
            }
            puVar3 = (mod->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
            lVar11 = (long)puVar3 -
                     (long)(mod->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                           _M_impl.super__Vector_impl_data._M_start;
          }
        }
        puVar3 = (mod->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        puVar5 = mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar6 = mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        (mod->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        puVar7 = (mod->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        puVar8 = (mod->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        (mod->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_start = puVar5;
        (mod->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish = puVar6;
        mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = puVar7;
        mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar8;
        mod[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = puVar3;
        bVar9 = RecFindRoots<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
                          (stack,pos + 1,roots,(bool)((byte)uVar16 & 1),depth,randv,
                           (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                            *)CONCAT44(uVar16,in_stack_fffffffffffffd88));
        if (bVar9) {
          bVar9 = RecFindRoots<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
                            (stack,pos,roots,true,depth,randv,
                             (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                              *)CONCAT44(uVar16,in_stack_fffffffffffffd88));
          goto LAB_00163a83;
        }
      }
LAB_00163a3e:
      bVar9 = false;
      goto LAB_00163a83;
    }
    iVar2._M_current =
         (roots->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (roots->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)roots,iVar2,__args);
    }
    else {
      *iVar2._M_current = *__args;
      (roots->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
  }
  bVar9 = true;
LAB_00163a83:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar9;
  }
  __stack_chk_fail();
}

Assistant:

bool RecFindRoots(std::vector<std::vector<typename F::Elem>>& stack, size_t pos, std::vector<typename F::Elem>& roots, bool fully_factorizable, int depth, typename F::Elem randv, const F& field) {
    auto& ppoly = stack[pos];
    // We assert ppoly.size() > 1 (instead of just ppoly.size() > 0) to additionally exclude
    // constants polynomials because
    //  - ppoly is not constant initially (this is ensured by FindRoots()), and
    //  - we never recurse on a constant polynomial.
    CHECK_SAFE(ppoly.size() > 1 && ppoly.back() == 1);
    /* 1st degree input: constant term is the root. */
    if (ppoly.size() == 2) {
        roots.push_back(ppoly[0]);
        return true;
    }
    /* 2nd degree input: use direct quadratic solver. */
    if (ppoly.size() == 3) {
        CHECK_RETURN(ppoly[1] != 0, false); // Equations of the form (x^2 + a) have two identical solutions; contradicts square-free assumption. */
        auto input = field.Mul(ppoly[0], field.Sqr(field.Inv(ppoly[1])));
        auto root = field.Qrt(input);
        if ((field.Sqr(root) ^ root) != input) {
            CHECK_SAFE(!fully_factorizable);
            return false; // No root found.
        }
        auto sol = field.Mul(root, ppoly[1]);
        roots.push_back(sol);
        roots.push_back(sol ^ ppoly[1]);
        return true;
    }
    /* 3rd degree input and more: recurse further. */
    if (pos + 3 > stack.size()) {
        // Allocate memory if necessary.
        stack.resize((pos + 3) * 2);
    }
    auto& poly = stack[pos];
    auto& tmp = stack[pos + 1];
    auto& trace = stack[pos + 2];
    trace.clear();
    tmp.clear();
    for (int iter = 0;; ++iter) {
        // Compute the polynomial (trace(x*randv) mod poly(x)) symbolically,
        // and put the result in `trace`.
        TraceMod(poly, trace, randv, field);

        if (iter >= 1 && !fully_factorizable) {
            // If the polynomial cannot be factorized completely (it has an
            // irreducible factor of degree higher than 1), we want to avoid
            // the case where this is only detected after trying all BITS
            // independent split attempts fail (see the assert below).
            //
            // Observe that if we call y = randv*x, it is true that:
            //
            //   trace = y + y^2 + y^4 + y^8 + ... y^(FIELDSIZE/2) mod poly
            //
            // Due to the Frobenius endomorphism, this means:
            //
            //   trace^2 = y^2 + y^4 + y^8 + ... + y^FIELDSIZE mod poly
            //
            // Or, adding them up:
            //
            //   trace + trace^2 = y + y^FIELDSIZE mod poly.
            //                   = randv*x + randv^FIELDSIZE*x^FIELDSIZE
            //                   = randv*x + randv*x^FIELDSIZE
            //                   = randv*(x + x^FIELDSIZE).
            //     (all mod poly)
            //
            // x + x^FIELDSIZE is the polynomial which has every field element
            // as root once. Whenever x + x^FIELDSIZE is multiple of poly,
            // this means it only has unique first degree factors. The same
            // holds for its constant multiple randv*(x + x^FIELDSIZE) =
            // trace + trace^2.
            //
            // We use this test to quickly verify whether the polynomial is
            // fully factorizable after already having computed a trace.
            // We don't invoke it immediately; only when splitting has failed
            // at least once, which avoids it for most polynomials that are
            // fully factorizable (or at least pushes the test down the
            // recursion to factors which are smaller and thus faster).
            tmp = trace;
            Sqr(tmp, field);
            for (size_t i = 0; i < trace.size(); ++i) {
                tmp[i] ^= trace[i];
            }
            while (tmp.size() && tmp.back() == 0) tmp.pop_back();
            PolyMod(poly, tmp, field);

            // Whenever the test fails, we can immediately abort the root
            // finding. Whenever it succeeds, we can remember and pass down
            // the information that it is in fact fully factorizable, avoiding
            // the need to run the test again.
            if (tmp.size() != 0) return false;
            fully_factorizable = true;
        }

        if (fully_factorizable) {
            // Every successful iteration of this algorithm splits the input
            // polynomial further into buckets, each corresponding to a subset
            // of 2^(BITS-depth) roots. If after depth splits the degree of
            // the polynomial is >= 2^(BITS-depth), something is wrong.
            CHECK_RETURN(field.Bits() - depth >= std::numeric_limits<decltype(poly.size())>::digits ||
                (poly.size() - 2) >> (field.Bits() - depth) == 0, false);
        }

        depth++;
        // In every iteration we multiply randv by 2. As a result, the set
        // of randv values forms a GF(2)-linearly independent basis of splits.
        randv = field.Mul2(randv);
        tmp = poly;
        GCD(trace, tmp, field);
        if (trace.size() != poly.size() && trace.size() > 1) break;
    }
    MakeMonic(trace, field);
    DivMod(trace, poly, tmp, field);
    // At this point, the stack looks like [... (poly) tmp trace], and we want to recursively
    // find roots of trace and tmp (= poly/trace). As we don't care about poly anymore, move
    // trace into its position first.
    std::swap(poly, trace);
    // Now the stack is [... (trace) tmp ...]. First we factor tmp (at pos = pos+1), and then
    // we factor trace (at pos = pos).
    if (!RecFindRoots(stack, pos + 1, roots, fully_factorizable, depth, randv, field)) return false;
    // The stack position pos contains trace, the polynomial with all of poly's roots which (after
    // multiplication with randv) have trace 0. This is never the case for irreducible factors
    // (which always end up in tmp), so we can set fully_factorizable to true when recursing.
    bool ret = RecFindRoots(stack, pos, roots, true, depth, randv, field);
    // Because of the above, recursion can never fail here.
    CHECK_SAFE(ret);
    return ret;
}